

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

Function * root(Function *left,Function *right)

{
  Function *right_local;
  Function *left_local;
  
  if ((left->eType == EMPTY) && (right->eType == EMPTY)) {
    left_local = empty();
  }
  else if (((left->eType != EMPTY) || (left_local = right, right->eType == EMPTY)) &&
          ((left->eType == EMPTY || (left_local = left, right->eType != EMPTY)))) {
    left_local = (Function *)operator_new(400);
    Function::Function(left_local,left,right,ROOT);
  }
  return left_local;
}

Assistant:

Function &root( Function &left, Function &right )
{	
	if (left.eType==EMPTY && right.eType==EMPTY)
		return empty();
	if (left.eType==EMPTY && right.eType!=EMPTY)
		return right;
	if (left.eType!=EMPTY && right.eType==EMPTY)
		return left;
	return *(new Function(left, right, ROOT));
}